

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O0

void P_TossItem(AActor *item)

{
  int iVar1;
  int local_14;
  int style;
  AActor *item_local;
  
  local_14 = FIntCVar::operator_cast_to_int(&sv_dropstyle);
  if (local_14 == 0) {
    local_14 = gameinfo.defaultdropstyle;
  }
  if (local_14 == 2) {
    iVar1 = FRandom::Random2(&pr_dropitem,7);
    (item->Vel).X = (double)iVar1 + (item->Vel).X;
    iVar1 = FRandom::Random2(&pr_dropitem,7);
    (item->Vel).Y = (double)iVar1 + (item->Vel).Y;
  }
  else {
    iVar1 = FRandom::Random2(&pr_dropitem);
    (item->Vel).X = (double)iVar1 / 256.0 + (item->Vel).X;
    iVar1 = FRandom::Random2(&pr_dropitem);
    (item->Vel).Y = (double)iVar1 / 256.0 + (item->Vel).Y;
    iVar1 = FRandom::operator()(&pr_dropitem);
    (item->Vel).Z = (double)iVar1 / 64.0 + 5.0;
  }
  return;
}

Assistant:

void P_TossItem (AActor *item)
{
	int style = sv_dropstyle;
	if (style==0) style = gameinfo.defaultdropstyle;
	
	if (style==2)
	{
		item->Vel.X += pr_dropitem.Random2(7);
		item->Vel.Y += pr_dropitem.Random2(7);
	}
	else
	{
		item->Vel.X += pr_dropitem.Random2() / 256.;
		item->Vel.Y += pr_dropitem.Random2() / 256.;
		item->Vel.Z = 5. + pr_dropitem() / 64.;
	}
}